

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<int> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::
Bind<std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>
          (Object<int> *this,string_view *name,
          function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  Object<int> *pOVar1;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> local_40;
  
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            (&local_40,func);
  pOVar1 = BindPrivate(this,name,&local_40,required);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }